

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O3

double __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::get_double
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,error_code *ec)

{
  value_type *__src;
  value_type *pvVar1;
  size_t sVar2;
  ulong uVar3;
  value_type *__src_00;
  uint8_t b;
  uint8_t buf [4];
  uint8_t buf_1 [8];
  byte local_35;
  uint local_34;
  ulong local_30;
  
  __src = (this->source_).current_;
  pvVar1 = (this->source_).end_;
  memcpy(&local_35,__src,(ulong)(pvVar1 != __src));
  __src_00 = __src + (pvVar1 != __src);
  (this->source_).current_ = __src_00;
  if (pvVar1 != __src) {
    if ((local_35 & 0x1f) == 0x1b) {
      uVar3 = (long)pvVar1 - (long)__src_00;
      sVar2 = 8;
      if (uVar3 < 8) {
        sVar2 = uVar3;
      }
      memcpy(&local_30,__src_00,sVar2);
      (this->source_).current_ = __src_00 + sVar2;
      if (7 < uVar3) {
        return (double)(local_30 >> 0x38 | (local_30 & 0xff000000000000) >> 0x28 |
                        (local_30 & 0xff0000000000) >> 0x18 | (local_30 & 0xff00000000) >> 8 |
                        (local_30 & 0xff000000) << 8 | (local_30 & 0xff0000) << 0x18 |
                        (local_30 & 0xff00) << 0x28 | local_30 << 0x38);
      }
    }
    else {
      if ((local_35 & 0x1f) != 0x1a) {
        return 0.0;
      }
      uVar3 = (long)pvVar1 - (long)__src_00;
      sVar2 = 4;
      if (uVar3 < 4) {
        sVar2 = uVar3;
      }
      memcpy(&local_34,__src_00,sVar2);
      (this->source_).current_ = __src_00 + sVar2;
      if (3 < uVar3) {
        return (double)(float)(local_34 >> 0x18 | (local_34 & 0xff0000) >> 8 |
                               (local_34 & 0xff00) << 8 | local_34 << 0x18);
      }
    }
  }
  std::error_code::operator=(ec,unexpected_eof);
  this->more_ = false;
  return 0.0;
}

Assistant:

double get_double(std::error_code& ec)
    {
        double val = 0;

        uint8_t b;
        if (source_.read(&b, 1) == 0)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return 0;
        }
        uint8_t info = get_additional_information_value(b);
        switch (info)
        {
        case 0x1a: // Single-Precision Float (four-byte IEEE 754)
            {
                uint8_t buf[sizeof(float)];
                if (source_.read(buf, sizeof(float)) !=sizeof(float)) 
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                val = binary::big_to_native<float>(buf, sizeof(buf));
                break;
            }

        case 0x1b: //  Double-Precision Float (eight-byte IEEE 754)
            {
                uint8_t buf[sizeof(double)];
                if (source_.read(buf, sizeof(double)) != sizeof(double))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                val = binary::big_to_native<double>(buf, sizeof(buf));
                break;
            }
            default:
                break;
        }
        
        return val;
    }